

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_cpols.cc
# Opt level: O0

void print_notice(BIO *out,USERNOTICE *notice,int indent)

{
  NOTICEREF *pNVar1;
  size_t sVar2;
  ASN1_INTEGER *pAVar3;
  char *pcVar4;
  char *tmp;
  ASN1_INTEGER *num;
  size_t i;
  NOTICEREF *ref;
  int indent_local;
  USERNOTICE *notice_local;
  BIO *out_local;
  
  if (notice->noticeref != (NOTICEREF *)0x0) {
    pNVar1 = notice->noticeref;
    BIO_printf((BIO *)out,"%*sOrganization: %.*s\n",(ulong)(uint)indent,"",
               (ulong)(uint)pNVar1->organization->length,pNVar1->organization->data);
    sVar2 = sk_ASN1_INTEGER_num(pNVar1->noticenos);
    pcVar4 = "";
    if (1 < sVar2) {
      pcVar4 = "s";
    }
    BIO_printf((BIO *)out,"%*sNumber%s: ",(ulong)(uint)indent,"",pcVar4);
    for (num = (ASN1_INTEGER *)0x0; pAVar3 = (ASN1_INTEGER *)sk_ASN1_INTEGER_num(pNVar1->noticenos),
        num < pAVar3; num = (ASN1_INTEGER *)((long)&num->length + 1)) {
      pAVar3 = sk_ASN1_INTEGER_value(pNVar1->noticenos,(size_t)num);
      if (num != (ASN1_INTEGER *)0x0) {
        BIO_puts((BIO *)out,", ");
      }
      if (pAVar3 == (ASN1_INTEGER *)0x0) {
        BIO_puts((BIO *)out,"(null)");
      }
      else {
        pcVar4 = i2s_ASN1_INTEGER((X509V3_EXT_METHOD *)0x0,(ASN1_INTEGER *)pAVar3);
        if (pcVar4 == (char *)0x0) {
          return;
        }
        BIO_puts((BIO *)out,pcVar4);
        OPENSSL_free(pcVar4);
      }
    }
    BIO_puts((BIO *)out,"\n");
  }
  if (notice->exptext != (ASN1_STRING *)0x0) {
    BIO_printf((BIO *)out,"%*sExplicit Text: %.*s\n",(ulong)(uint)indent,"",
               (ulong)(uint)notice->exptext->length,notice->exptext->data);
  }
  return;
}

Assistant:

static void print_notice(BIO *out, const USERNOTICE *notice, int indent) {
  if (notice->noticeref) {
    NOTICEREF *ref;
    ref = notice->noticeref;
    BIO_printf(out, "%*sOrganization: %.*s\n", indent, "",
               ref->organization->length, ref->organization->data);
    BIO_printf(out, "%*sNumber%s: ", indent, "",
               sk_ASN1_INTEGER_num(ref->noticenos) > 1 ? "s" : "");
    for (size_t i = 0; i < sk_ASN1_INTEGER_num(ref->noticenos); i++) {
      ASN1_INTEGER *num;
      char *tmp;
      num = sk_ASN1_INTEGER_value(ref->noticenos, i);
      if (i) {
        BIO_puts(out, ", ");
      }
      if (num == NULL) {
        BIO_puts(out, "(null)");
      } else {
        tmp = i2s_ASN1_INTEGER(NULL, num);
        if (tmp == NULL) {
          return;
        }
        BIO_puts(out, tmp);
        OPENSSL_free(tmp);
      }
    }
    BIO_puts(out, "\n");
  }
  if (notice->exptext) {
    BIO_printf(out, "%*sExplicit Text: %.*s\n", indent, "",
               notice->exptext->length, notice->exptext->data);
  }
}